

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

IdList * sqlite3IdListAppend(sqlite3 *db,IdList *pList,Token *pToken)

{
  undefined8 in_RAX;
  IdList_item *pIVar1;
  char *pcVar2;
  int i;
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  if (pList == (IdList *)0x0) {
    pList = (IdList *)sqlite3DbMallocRaw(db,0x10);
    if (pList == (IdList *)0x0) {
      return (IdList *)0x0;
    }
    pList->a = (IdList_item *)0x0;
    *(undefined8 *)&pList->nId = 0;
  }
  pIVar1 = (IdList_item *)sqlite3ArrayAllocate(db,pList->a,0x10,&pList->nId,&local_24);
  pList->a = pIVar1;
  if ((long)local_24 < 0) {
    sqlite3IdListDelete(db,pList);
    return (IdList *)0x0;
  }
  pcVar2 = sqlite3NameFromToken(db,pToken);
  pList->a[local_24].zName = pcVar2;
  return pList;
}

Assistant:

SQLITE_PRIVATE IdList *sqlite3IdListAppend(sqlite3 *db, IdList *pList, Token *pToken){
  int i;
  if( pList==0 ){
    pList = sqlite3DbMallocZero(db, sizeof(IdList) );
    if( pList==0 ) return 0;
  }
  pList->a = sqlite3ArrayAllocate(
      db,
      pList->a,
      sizeof(pList->a[0]),
      &pList->nId,
      &i
  );
  if( i<0 ){
    sqlite3IdListDelete(db, pList);
    return 0;
  }
  pList->a[i].zName = sqlite3NameFromToken(db, pToken);
  return pList;
}